

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int op_delete(lua_State *L)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *s;
  char *key;
  lua_Integer lVar4;
  long lVar5;
  size_t sz;
  buffer buf;
  luaL_Buffer b;
  
  s = (int *)lua_touserdata(L,3);
  if (s == (int *)0x0) {
    luaL_error(L,"Invalid param");
  }
  sz = 0;
  key = luaL_checklstring(L,1,&sz);
  luaL_buffinit(L,&b);
  buf.ptr = buf.buffer;
  buf.size = 0;
  buf.cap = 0x80;
  iVar2 = reserve_length(&buf);
  write_int32(&buf,0);
  write_int32(&buf,0);
  write_int32(&buf,0x7d6);
  write_int32(&buf,0);
  write_string(&buf,key,sz);
  lVar4 = lua_tointegerx(L,2,(int *)0x0);
  write_int32(&buf,(int32_t)lVar4);
  iVar1 = *s;
  iVar3 = buf.size + iVar1;
  lVar5 = (long)iVar2;
  buf.ptr[lVar5] = (uint8_t)iVar3;
  buf.ptr[lVar5 + 1] = (uint8_t)((uint)iVar3 >> 8);
  buf.ptr[lVar5 + 2] = (uint8_t)((uint)iVar3 >> 0x10);
  buf.ptr[lVar5 + 3] = (uint8_t)((uint)iVar3 >> 0x18);
  luaL_addlstring(&b,(char *)buf.ptr,(long)buf.size);
  buffer_destroy(&buf);
  luaL_addlstring(&b,(char *)s,(long)iVar1);
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int
op_delete(lua_State *L) {
	document selector  = lua_touserdata(L,3);
	if (selector == NULL) {
		luaL_error(L, "Invalid param");
	}
	size_t sz = 0;
	const char * name = luaL_checklstring(L,1,&sz);

	luaL_Buffer b;
	luaL_buffinit(L,&b);

	struct buffer buf;
	buffer_create(&buf);
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_DELETE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, lua_tointeger(L,2));

		int32_t selector_len = get_length(selector);
		int total = buf.size + selector_len;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	luaL_addlstring(&b, (const char *)selector, selector_len);
	luaL_pushresult(&b);

	return 1;
}